

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O3

bool __thiscall despot::Pocman::HearGhost(Pocman *this,PocmanState *pocstate)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  if (this->num_ghosts_ < 1) {
    return false;
  }
  lVar3 = 0;
  do {
    iVar2 = despot::Coord::ManhattanDistance
                      (*(undefined8 *)
                        ((pocstate->ghost_pos).
                         super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar3 * 8),
                       *(undefined8 *)&pocstate->pocman_pos);
    iVar1 = this->hear_range_;
    if (iVar2 <= iVar1) {
      return iVar2 <= iVar1;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 < this->num_ghosts_);
  return iVar2 <= iVar1;
}

Assistant:

bool Pocman::HearGhost(const PocmanState& pocstate) const {
	for (int g = 0; g < num_ghosts_; g++)
		if (Coord::ManhattanDistance(pocstate.ghost_pos[g], pocstate.pocman_pos)
			<= hear_range_)
			return true;
	return false;
}